

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_enc.c
# Opt level: O0

int BackwardReferencesLz77Box
              (int xsize,int ysize,uint32_t *argb,int cache_bits,VP8LHashChain *hash_chain_best,
              VP8LHashChain *hash_chain,VP8LBackwardRefs *refs)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  VP8LHashChain *hash_chain_00;
  long in_RDX;
  int in_ESI;
  int in_EDI;
  VP8LHashChain *in_R8;
  long *in_R9;
  bool bVar7;
  int counts_j;
  int counts_j_offset;
  int j_offset;
  int j_1;
  int curr_length;
  int num_ind;
  int use_prev;
  int do_compute;
  int best_offset;
  int best_length;
  int ind;
  int is_reachable;
  int j;
  int plane_code;
  int offset;
  int y;
  int x;
  int best_length_prev;
  int best_offset_prev;
  uint16_t *counts_ini;
  int window_offsets_new_size;
  int window_offsets_size;
  int window_offsets_new [32];
  int window_offsets [32];
  uint16_t *counts;
  int pix_count;
  int i;
  int local_1c4;
  undefined4 in_stack_fffffffffffffe40;
  undefined4 in_stack_fffffffffffffe44;
  undefined4 in_stack_fffffffffffffe48;
  undefined4 in_stack_fffffffffffffe4c;
  uint local_1b0;
  int local_19c;
  int local_198;
  uint local_194;
  int local_184;
  uint local_180;
  int local_17c;
  int local_174;
  int local_168;
  int local_164;
  int iVar8;
  int local_150;
  int cache_bits_00;
  uint32_t *in_stack_fffffffffffffeb8;
  int in_stack_fffffffffffffec0;
  int in_stack_fffffffffffffec4;
  int local_c8 [34];
  short *local_40;
  int local_38;
  int local_34;
  long *local_30;
  VP8LHashChain *local_28;
  long local_18;
  int local_8;
  int local_4;
  
  local_38 = in_EDI * in_ESI;
  local_30 = in_R9;
  local_28 = in_R8;
  local_18 = in_RDX;
  local_8 = in_EDI;
  memset(local_c8,0,0x80);
  memset(&stack0xfffffffffffffeb8,0,0x80);
  cache_bits_00 = 0;
  local_150 = 0;
  hash_chain_00 =
       (VP8LHashChain *)
       WebPSafeMalloc(CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48),
                      CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40));
  iVar8 = -1;
  local_1b0 = 0xffffffff;
  if (hash_chain_00 == (VP8LHashChain *)0x0) {
    local_4 = 0;
  }
  else {
    local_34 = local_38 + -2;
    local_40 = (short *)((long)&hash_chain_00->offset_length + (long)local_34 * 2);
    local_40[1] = 1;
    for (; -1 < local_34; local_34 = local_34 + -1) {
      if (*(int *)(local_18 + (long)local_34 * 4) == *(int *)(local_18 + (long)(local_34 + 1) * 4))
      {
        *local_40 = local_40[1] + (ushort)(local_40[1] != 0xfff);
      }
      else {
        *local_40 = 1;
      }
      local_40 = local_40 + -1;
    }
    for (local_168 = 0; local_168 < 7; local_168 = local_168 + 1) {
      for (local_164 = -6; local_164 < 7; local_164 = local_164 + 1) {
        iVar3 = local_168 * local_8 + local_164;
        if (0 < iVar3) {
          iVar4 = VP8LDistanceToPlaneCode(local_8,iVar3);
          if (iVar4 + -1 < 0x20) {
            local_c8[iVar4 + -1] = iVar3;
          }
        }
      }
    }
    for (local_34 = 0; local_34 < 0x20; local_34 = local_34 + 1) {
      if (local_c8[local_34] != 0) {
        local_c8[cache_bits_00] = local_c8[local_34];
        cache_bits_00 = cache_bits_00 + 1;
      }
    }
    for (local_34 = 0; local_34 < cache_bits_00; local_34 = local_34 + 1) {
      bVar1 = false;
      local_174 = 0;
      while( true ) {
        bVar2 = false;
        if (local_174 < cache_bits_00) {
          bVar2 = (bool)(bVar1 ^ 1);
        }
        if (!bVar2) break;
        bVar1 = (bool)(local_c8[local_34] == local_c8[local_174] + 1 | bVar1);
        local_174 = local_174 + 1;
      }
      if (!bVar1) {
        *(int *)(&stack0xfffffffffffffeb8 + (long)local_150 * 4) = local_c8[local_34];
        local_150 = local_150 + 1;
      }
    }
    *(undefined4 *)*local_30 = 0;
    for (local_34 = 1; local_34 < local_38; local_34 = local_34 + 1) {
      local_180 = VP8LHashChainFindLength(local_28,local_34);
      bVar1 = true;
      if (0xffe < (int)local_180) {
        local_184 = VP8LHashChainFindOffset(local_28,local_34);
        for (local_17c = 0; local_17c < cache_bits_00; local_17c = local_17c + 1) {
          if (local_184 == local_c8[local_17c]) {
            bVar1 = false;
            break;
          }
        }
      }
      if (bVar1) {
        bVar2 = (int)local_1b0 < 2;
        bVar1 = 0xffe < (int)local_1b0;
        if (bVar2 || bVar1) {
          local_1b0 = 0;
          iVar3 = cache_bits_00;
        }
        else {
          local_1b0 = local_1b0 - 1;
          iVar3 = local_150;
        }
        local_180 = local_1b0;
        if (bVar2 || bVar1) {
          iVar8 = 0;
        }
        local_184 = iVar8;
        for (local_17c = 0; local_17c < iVar3; local_17c = local_17c + 1) {
          local_194 = 0;
          local_198 = local_34;
          if (bVar2 || bVar1) {
            local_19c = local_c8[local_17c];
          }
          else {
            local_19c = *(int *)(&stack0xfffffffffffffeb8 + (long)local_17c * 4);
          }
          local_19c = local_34 - local_19c;
          if ((-1 < local_19c) &&
             (*(int *)(local_18 + (long)local_19c * 4) == *(int *)(local_18 + (long)local_34 * 4)))
          {
            do {
              uVar5 = (uint)*(ushort *)((long)&hash_chain_00->offset_length + (long)local_19c * 2);
              uVar6 = (uint)*(ushort *)((long)&hash_chain_00->offset_length + (long)local_198 * 2);
              if (uVar5 != uVar6) {
                if (uVar5 < uVar6) {
                  uVar6 = uVar5;
                }
                local_194 = uVar6 + local_194;
                break;
              }
              local_194 = uVar5 + local_194;
              local_19c = uVar5 + local_19c;
              local_198 = uVar5 + local_198;
              bVar7 = false;
              if (((int)local_194 < 0x1000) && (bVar7 = false, local_198 < local_38)) {
                bVar7 = *(int *)(local_18 + (long)local_19c * 4) ==
                        *(int *)(local_18 + (long)local_198 * 4);
              }
            } while (bVar7);
            if ((int)local_180 < (int)local_194) {
              if (bVar2 || bVar1) {
                local_1c4 = local_c8[local_17c];
              }
              else {
                local_1c4 = *(int *)(&stack0xfffffffffffffeb8 + (long)local_17c * 4);
              }
              local_184 = local_1c4;
              if (0xffe < (int)local_194) {
                local_180 = 0xfff;
                break;
              }
              local_180 = local_194;
            }
          }
        }
      }
      if ((int)local_180 < 5) {
        *(undefined4 *)(*local_30 + (long)local_34 * 4) = 0;
        local_180 = 0;
        iVar8 = 0;
      }
      else {
        *(uint *)(*local_30 + (long)local_34 * 4) = local_184 << 0xc | local_180;
        iVar8 = local_184;
      }
      local_1b0 = local_180;
    }
    *(undefined4 *)*local_30 = 0;
    WebPSafeFree((void *)0x190634);
    local_4 = BackwardReferencesLz77
                        (in_stack_fffffffffffffec4,in_stack_fffffffffffffec0,
                         in_stack_fffffffffffffeb8,cache_bits_00,hash_chain_00,
                         (VP8LBackwardRefs *)CONCAT44(iVar8,local_1b0));
  }
  return local_4;
}

Assistant:

static int BackwardReferencesLz77Box(int xsize, int ysize,
                                     const uint32_t* const argb, int cache_bits,
                                     const VP8LHashChain* const hash_chain_best,
                                     VP8LHashChain* hash_chain,
                                     VP8LBackwardRefs* const refs) {
  int i;
  const int pix_count = xsize * ysize;
  uint16_t* counts;
  int window_offsets[WINDOW_OFFSETS_SIZE_MAX] = {0};
  int window_offsets_new[WINDOW_OFFSETS_SIZE_MAX] = {0};
  int window_offsets_size = 0;
  int window_offsets_new_size = 0;
  uint16_t* const counts_ini =
      (uint16_t*)WebPSafeMalloc(xsize * ysize, sizeof(*counts_ini));
  int best_offset_prev = -1, best_length_prev = -1;
  if (counts_ini == NULL) return 0;

  // counts[i] counts how many times a pixel is repeated starting at position i.
  i = pix_count - 2;
  counts = counts_ini + i;
  counts[1] = 1;
  for (; i >= 0; --i, --counts) {
    if (argb[i] == argb[i + 1]) {
      // Max out the counts to MAX_LENGTH.
      counts[0] = counts[1] + (counts[1] != MAX_LENGTH);
    } else {
      counts[0] = 1;
    }
  }

  // Figure out the window offsets around a pixel. They are stored in a
  // spiraling order around the pixel as defined by VP8LDistanceToPlaneCode.
  {
    int x, y;
    for (y = 0; y <= 6; ++y) {
      for (x = -6; x <= 6; ++x) {
        const int offset = y * xsize + x;
        int plane_code;
        // Ignore offsets that bring us after the pixel.
        if (offset <= 0) continue;
        plane_code = VP8LDistanceToPlaneCode(xsize, offset) - 1;
        if (plane_code >= WINDOW_OFFSETS_SIZE_MAX) continue;
        window_offsets[plane_code] = offset;
      }
    }
    // For narrow images, not all plane codes are reached, so remove those.
    for (i = 0; i < WINDOW_OFFSETS_SIZE_MAX; ++i) {
      if (window_offsets[i] == 0) continue;
      window_offsets[window_offsets_size++] = window_offsets[i];
    }
    // Given a pixel P, find the offsets that reach pixels unreachable from P-1
    // with any of the offsets in window_offsets[].
    for (i = 0; i < window_offsets_size; ++i) {
      int j;
      int is_reachable = 0;
      for (j = 0; j < window_offsets_size && !is_reachable; ++j) {
        is_reachable |= (window_offsets[i] == window_offsets[j] + 1);
      }
      if (!is_reachable) {
        window_offsets_new[window_offsets_new_size] = window_offsets[i];
        ++window_offsets_new_size;
      }
    }
  }

  hash_chain->offset_length[0] = 0;
  for (i = 1; i < pix_count; ++i) {
    int ind;
    int best_length = VP8LHashChainFindLength(hash_chain_best, i);
    int best_offset;
    int do_compute = 1;

    if (best_length >= MAX_LENGTH) {
      // Do not recompute the best match if we already have a maximal one in the
      // window.
      best_offset = VP8LHashChainFindOffset(hash_chain_best, i);
      for (ind = 0; ind < window_offsets_size; ++ind) {
        if (best_offset == window_offsets[ind]) {
          do_compute = 0;
          break;
        }
      }
    }
    if (do_compute) {
      // Figure out if we should use the offset/length from the previous pixel
      // as an initial guess and therefore only inspect the offsets in
      // window_offsets_new[].
      const int use_prev =
          (best_length_prev > 1) && (best_length_prev < MAX_LENGTH);
      const int num_ind =
          use_prev ? window_offsets_new_size : window_offsets_size;
      best_length = use_prev ? best_length_prev - 1 : 0;
      best_offset = use_prev ? best_offset_prev : 0;
      // Find the longest match in a window around the pixel.
      for (ind = 0; ind < num_ind; ++ind) {
        int curr_length = 0;
        int j = i;
        int j_offset =
            use_prev ? i - window_offsets_new[ind] : i - window_offsets[ind];
        if (j_offset < 0 || argb[j_offset] != argb[i]) continue;
        // The longest match is the sum of how many times each pixel is
        // repeated.
        do {
          const int counts_j_offset = counts_ini[j_offset];
          const int counts_j = counts_ini[j];
          if (counts_j_offset != counts_j) {
            curr_length +=
                (counts_j_offset < counts_j) ? counts_j_offset : counts_j;
            break;
          }
          // The same color is repeated counts_pos times at j_offset and j.
          curr_length += counts_j_offset;
          j_offset += counts_j_offset;
          j += counts_j_offset;
        } while (curr_length <= MAX_LENGTH && j < pix_count &&
                 argb[j_offset] == argb[j]);
        if (best_length < curr_length) {
          best_offset =
              use_prev ? window_offsets_new[ind] : window_offsets[ind];
          if (curr_length >= MAX_LENGTH) {
            best_length = MAX_LENGTH;
            break;
          } else {
            best_length = curr_length;
          }
        }
      }
    }

    assert(i + best_length <= pix_count);
    assert(best_length <= MAX_LENGTH);
    if (best_length <= MIN_LENGTH) {
      hash_chain->offset_length[i] = 0;
      best_offset_prev = 0;
      best_length_prev = 0;
    } else {
      hash_chain->offset_length[i] =
          (best_offset << MAX_LENGTH_BITS) | (uint32_t)best_length;
      best_offset_prev = best_offset;
      best_length_prev = best_length;
    }
  }
  hash_chain->offset_length[0] = 0;
  WebPSafeFree(counts_ini);

  return BackwardReferencesLz77(xsize, ysize, argb, cache_bits, hash_chain,
                                refs);
}